

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::piece_picker::mark_as_downloading
          (piece_picker *this,piece_block block,torrent_peer *peer,picker_options_t options)

{
  value_type *this_00;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> idx;
  bool bVar1;
  bool bVar2;
  int priority;
  block_info *pbVar3;
  reference pdVar4;
  pointer pdVar5;
  bool local_102;
  download_queue_t *local_100;
  int prio_2;
  downloading_piece *local_d8;
  downloading_piece *local_d0;
  int local_c8;
  int local_c4;
  undefined2 local_be;
  int prio_1;
  block_info *local_b8;
  block_info *info_1;
  span<libtorrent::aux::piece_picker::block_info> binfo_1;
  __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_98;
  iterator i;
  block_info *info;
  span<libtorrent::aux::piece_picker::block_info> binfo;
  __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_60;
  iterator dp;
  unsigned_short local_4a;
  int local_48;
  undefined2 local_44;
  unsigned_short local_42;
  unsigned_short local_40;
  uchar local_3d;
  int local_3c;
  strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void> local_35;
  int prio;
  value_type *local_30;
  piece_pos *p;
  torrent_peer *peer_local;
  piece_picker *this_local;
  int iStack_10;
  picker_options_t options_local;
  piece_block block_local;
  
  this_local._4_4_ = (int)block.piece_index.m_val;
  prio = this_local._4_4_;
  p = (piece_pos *)peer;
  peer_local = (torrent_peer *)this;
  this_local._2_2_ = options.m_val;
  idx.m_val = this_local._4_4_;
  unique0x1000045d = block;
  local_30 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
             ::operator[](&this->m_piece_map,idx);
  local_35.m_val = (uchar)piece_pos::download_queue(local_30);
  bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator==
                    (&local_35,&piece_pos::piece_open);
  if (bVar1) {
    local_3c = piece_pos::priority(local_30,this);
    this_00 = local_30;
    local_42 = this_local._2_2_;
    local_44 = 2;
    local_40 = (unsigned_short)
               libtorrent::flags::operator&
                         (this_local._2_2_,
                          (bitfield_flag<unsigned_short,_libtorrent::aux::picker_options_tag,_void>)
                          0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_40);
    if (bVar1) {
      local_100 = &piece_pos::piece_downloading_reverse;
    }
    else {
      local_100 = &piece_pos::piece_downloading;
    }
    local_3d = local_100->m_val;
    piece_pos::state(this_00,(download_queue_t)local_3d);
    if ((-1 < local_3c) && ((this->m_dirty & 1U) == 0)) {
      local_48 = (local_30->index).m_val;
      update(this,local_3c,(prio_index_t)local_48);
    }
    local_4a = (unsigned_short)
               libtorrent::flags::operator&
                         (this_local._2_2_,
                          (bitfield_flag<unsigned_short,_libtorrent::aux::picker_options_tag,_void>)
                          0x80);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_4a);
    if (bVar1) {
      dp._M_current._4_4_ = this_local._4_4_;
      record_downloading_piece(this,(piece_index_t)this_local._4_4_);
    }
    binfo.m_len._4_4_ = this_local._4_4_;
    local_60._M_current =
         (downloading_piece *)add_download_piece(this,(piece_index_t)this_local._4_4_);
    pdVar4 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
             ::operator*(&local_60);
    _info = mutable_blocks_for_piece(this,pdVar4);
    pbVar3 = span<libtorrent::aux::piece_picker::block_info>::operator[]
                       ((span<libtorrent::aux::piece_picker::block_info> *)&info,(long)iStack_10);
    if (*(ushort *)&pbVar3->field_0x8 >> 0xe == 3) {
      return false;
    }
    *(ushort *)&pbVar3->field_0x8 = *(ushort *)&pbVar3->field_0x8 & 0x3fff | 0x4000;
    pbVar3->peer = (torrent_peer *)p;
    *(ushort *)&pbVar3->field_0x8 = *(ushort *)&pbVar3->field_0x8 & 0xc000 | 1;
    pdVar5 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
             ::operator->(&local_60);
    *(ushort *)&pdVar5->field_0xa =
         *(ushort *)&pdVar5->field_0xa & 0x8000 |
         (*(ushort *)&pdVar5->field_0xa & 0x7fff) + 1 & 0x7fff;
    update_piece_state(this,(iterator)local_60._M_current);
  }
  else {
    binfo_1.m_len._7_1_ = piece_pos::download_queue(local_30);
    binfo_1.m_len._0_4_ = this_local._4_4_;
    local_98._M_current =
         (downloading_piece *)
         find_dl_piece(this,binfo_1.m_len._7_1_,(piece_index_t)this_local._4_4_);
    pdVar4 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
             ::operator*(&local_98);
    _info_1 = mutable_blocks_for_piece(this,pdVar4);
    local_b8 = span<libtorrent::aux::piece_picker::block_info>::operator[]
                         ((span<libtorrent::aux::piece_picker::block_info> *)&info_1,(long)iStack_10
                         );
    if ((*(ushort *)&local_b8->field_0x8 >> 0xe == 2) ||
       (*(ushort *)&local_b8->field_0x8 >> 0xe == 3)) {
      return false;
    }
    prio_1._0_2_ = this_local._2_2_;
    local_be = 2;
    prio_1._2_2_ = libtorrent::flags::operator&
                             (this_local._2_2_,
                              (bitfield_flag<unsigned_short,_libtorrent::aux::picker_options_tag,_void>
                               )0x2);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                      ((bitfield_flag *)((long)&prio_1 + 2));
    bVar1 = false;
    if (bVar2) {
      bVar2 = piece_pos::reverse(local_30);
      bVar1 = false;
      if (!bVar2) {
        pdVar5 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
                 ::operator->(&local_98);
        bVar1 = (*(ushort *)&pdVar5->field_0xa & 0x7fff) == 0;
      }
    }
    if (bVar1) {
      local_c4 = piece_pos::priority(local_30,this);
      piece_pos::make_reverse(local_30);
      if ((-1 < local_c4) && ((this->m_dirty & 1U) == 0)) {
        local_c8 = (local_30->index).m_val;
        update(this,local_c4,(prio_index_t)local_c8);
      }
    }
    local_b8->peer = (torrent_peer *)p;
    if (*(ushort *)&local_b8->field_0x8 >> 0xe != 1) {
      *(ushort *)&local_b8->field_0x8 = *(ushort *)&local_b8->field_0x8 & 0x3fff | 0x4000;
      pdVar5 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_98);
      *(ushort *)&pdVar5->field_0xa =
           *(ushort *)&pdVar5->field_0xa & 0x8000 |
           (*(ushort *)&pdVar5->field_0xa & 0x7fff) + 1 & 0x7fff;
      local_d8 = local_98._M_current;
      local_d0 = (downloading_piece *)update_piece_state(this,local_98._M_current);
      local_98._M_current = local_d0;
    }
    *(ushort *)&local_b8->field_0x8 =
         *(ushort *)&local_b8->field_0x8 & 0xc000 |
         (*(ushort *)&local_b8->field_0x8 & 0x3fff) + 1 & 0x3fff;
    prio_2._0_2_ = this_local._2_2_;
    prio_2._2_2_ = libtorrent::flags::operator&
                             (this_local._2_2_,
                              (bitfield_flag<unsigned_short,_libtorrent::aux::picker_options_tag,_void>
                               )0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                      ((bitfield_flag *)((long)&prio_2 + 2));
    local_102 = false;
    if (!bVar1) {
      local_102 = piece_pos::reverse(local_30);
    }
    if (local_102 != false) {
      priority = piece_pos::priority(local_30,this);
      piece_pos::unreverse(local_30);
      if ((-1 < priority) && ((this->m_dirty & 1U) == 0)) {
        update(this,priority,(prio_index_t)(local_30->index).m_val);
      }
    }
  }
  return true;
}

Assistant:

bool piece_picker::mark_as_downloading(piece_block const block
		, aux::torrent_peer* peer, picker_options_t const options)
	{
#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "mark_as_downloading( {"
			<< block.piece_index << ", " << block.block_index << "} )" << std::endl;
#endif

		TORRENT_ASSERT(peer == nullptr || peer->in_use);
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());
		TORRENT_ASSERT(block.block_index < blocks_in_piece(block.piece_index));
		TORRENT_ASSERT(!m_piece_map[block.piece_index].have());

		piece_pos& p = m_piece_map[block.piece_index];
		if (p.download_queue() == piece_pos::piece_open)
		{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
			INVARIANT_CHECK;
#endif
			int const prio = p.priority(this);
			TORRENT_ASSERT(prio < int(m_priority_boundaries.size())
				|| m_dirty);

			p.state((options & reverse)
				? piece_pos::piece_downloading_reverse
				: piece_pos::piece_downloading);

			if (prio >= 0 && !m_dirty) update(prio, p.index);

			// if the piece extent affinity is enabled, (maybe) record downloading a
			// block from this piece to make other peers prefer adjacent pieces
			// if reverse is set, don't encourage other peers to pick nearby
			// pieces, as that's assumed to be low priority.
			// if time critical mode is enabled, we're likely to either download
			// adjacent pieces anyway, but more importantly, we don't want to
			// create artificially higher priority for adjacent pieces if they
			// aren't important or urgent
			if (options & piece_extent_affinity)
				record_downloading_piece(block.piece_index);

			auto const dp = add_download_piece(block.piece_index);
			auto const binfo = mutable_blocks_for_piece(*dp);
			block_info& info = binfo[block.block_index];
			TORRENT_ASSERT(info.piece_index == block.piece_index);
			if (info.state == block_info::state_finished)
				return false;

			info.state = block_info::state_requested;
			info.peer = peer;
			info.num_peers = 1;
#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(info.peers.count(peer) == 0);
			info.peers.insert(peer);
#endif
			++dp->requested;
			// update_full may move the downloading piece to
			// a different vector, so 'dp' may be invalid after
			// this call
			update_piece_state(dp);
		}
		else
		{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
			INVARIANT_CHECK;
#endif
			auto i = find_dl_piece(p.download_queue(), block.piece_index);
			TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());
			auto const binfo = mutable_blocks_for_piece(*i);
			block_info& info = binfo[block.block_index];
			TORRENT_ASSERT(info.piece_index == block.piece_index);
			if (info.state == block_info::state_writing
				|| info.state == block_info::state_finished)
			{
				return false;
			}

			if ((options & reverse) && !p.reverse() && i->requested == 0)
			{
				// this piece isn't reverse, but there's no other peer
				// downloading from it and we just requested a block from a
				// reverse peer. Make it reverse
				int prio = p.priority(this);
				p.make_reverse();
				if (prio >= 0 && !m_dirty) update(prio, p.index);
			}

			TORRENT_ASSERT(info.state == block_info::state_none
				|| (info.state == block_info::state_requested
					&& (info.num_peers > 0)));
			info.peer = peer;
			if (info.state != block_info::state_requested)
			{
				info.state = block_info::state_requested;
				++i->requested;
				i = update_piece_state(i);
			}
			++info.num_peers;

			// if we make a non-reverse request from a reversed piece,
			// undo the reverse state
			if (!(options & reverse) && p.reverse())
			{
				int prio = p.priority(this);
				// make it non-reverse
				p.unreverse();
				if (prio >= 0 && !m_dirty) update(prio, p.index);
			}

#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(info.peers.count(peer) == 0);
			info.peers.insert(peer);
#endif
		}
		return true;
	}